

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O2

TPZGeoMesh * __thiscall
TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(TPZAcademicGeoMesh *this)

{
  uint uVar1;
  int iVar2;
  TPZAcademicGeoMesh *this_00;
  TPZGeoMesh *this_01;
  TPZGeoNode *pTVar3;
  int i;
  int iVar4;
  long lVar5;
  long lVar6;
  int inode;
  int iVar7;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_02;
  int64_t local_208;
  int64_t index_1;
  int64_t local_1f8;
  long local_1f0;
  TPZGeoMesh *local_1e8;
  TPZAcademicGeoMesh *local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  double local_1b0;
  long local_1a8;
  ulong local_1a0;
  TPZStack<int,_10> perm;
  TPZManVector<long,_8> el_nodes;
  int64_t index;
  long *local_e8;
  TPZManVector<double,_3> x;
  TPZManVector<int,_8> indexes;
  
  local_1f8 = this->fNumberElements;
  uVar1 = this->fMaterialId;
  this_01 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_01);
  GenerateNodes(this,this_01);
  this_01->fDim = 3;
  local_208 = (this_01->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
  TPZStack<int,_10>::TPZStack(&perm);
  TPZStack<int,_10>::Push(&perm,0);
  TPZStack<int,_10>::Push(&perm,1);
  TPZStack<int,_10>::Push(&perm,3);
  TPZStack<int,_10>::Push(&perm,2);
  TPZStack<int,_10>::Push(&perm,4);
  TPZStack<int,_10>::Push(&perm,5);
  TPZStack<int,_10>::Push(&perm,7);
  TPZStack<int,_10>::Push(&perm,6);
  local_1e0 = this;
  TPZManVector<int,_8>::TPZManVector(&indexes,8);
  local_1f0 = local_1f8 + 1;
  iVar4 = (int)local_1f0;
  this_02 = &this_01->fNodeVec;
  lVar5 = 0;
  local_1d8 = 0;
  if (0 < local_1f8) {
    local_1d8 = local_1f8;
  }
  local_1b0 = 0.5 / (double)local_1f8;
  local_1e8 = this_01;
  while (lVar5 != local_1d8) {
    local_1c8 = local_1f0 * lVar5;
    lVar6 = 0;
    local_1d0 = lVar5;
    while (lVar6 != local_1f8) {
      iVar7 = ((int)local_1c8 + (int)lVar6) * (int)local_1f0;
      local_1a0 = (ulong)(uint)((int)local_1f0 + iVar7);
      local_1a8 = lVar6 + local_1d0;
      lVar5 = 0;
      local_1b8 = lVar6;
      while (lVar5 != local_1f8) {
        iVar2 = (int)lVar5;
        *indexes.super_TPZVec<int>.fStore = iVar2 + iVar7;
        lVar5 = lVar5 + 1;
        indexes.super_TPZVec<int>.fStore[1] = (int)lVar5 + iVar7;
        indexes.super_TPZVec<int>.fStore[2] = iVar2 + (int)local_1a0;
        indexes.super_TPZVec<int>.fStore[3] = (int)lVar5 + (int)local_1a0;
        for (lVar6 = -0x10; lVar6 != 0; lVar6 = lVar6 + 4) {
          *(int *)((long)indexes.super_TPZVec<int>.fStore + lVar6 + 0x20) =
               *(int *)((long)indexes.super_TPZVec<int>.fStore + lVar6 + 0x10) + iVar4 * iVar4;
        }
        if ((iVar2 + (int)local_1a8 & 1U) == 0) {
          TPZManVector<long,_8>::TPZManVector(&el_nodes,8);
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
            pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_02->super_TPZChunkVector<TPZGeoNode,_10>,
                                (long)indexes.super_TPZVec<int>.fStore
                                      [perm.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                                       [lVar6]]);
            el_nodes.super_TPZVec<long>.fStore[lVar6] = (long)pTVar3->fId;
          }
          TPZManVector<double,_3>::TPZManVector(&x,3);
          pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_02->super_TPZChunkVector<TPZGeoNode,_10>,
                              *el_nodes.super_TPZVec<long>.fStore);
          this_01 = local_1e8;
          TPZGeoNode::GetCoordinates(pTVar3,&x.super_TPZVec<double>);
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            x.super_TPZVec<double>.fStore[lVar6] = x.super_TPZVec<double>.fStore[lVar6] + local_1b0;
          }
          TPZAdmChunkVector<TPZGeoNode,_10>::Resize(this_02,(int)(local_208 + 1));
          pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_02->super_TPZChunkVector<TPZGeoNode,_10>,local_208);
          TPZGeoNode::Initialize(pTVar3,&x.super_TPZVec<double>,this_01);
          pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_02->super_TPZChunkVector<TPZGeoNode,_10>,local_208);
          lVar6 = (long)pTVar3->fId;
          local_1c0 = local_208 + 1;
          TPZManVector<long,_5>::TPZManVector((TPZManVector<long,_5> *)&index,5);
          *local_e8 = *el_nodes.super_TPZVec<long>.fStore;
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[1];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[2];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[3];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          *local_e8 = *el_nodes.super_TPZVec<long>.fStore;
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[3];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[7];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[4];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          *local_e8 = *el_nodes.super_TPZVec<long>.fStore;
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[1];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[5];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[4];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          *local_e8 = el_nodes.super_TPZVec<long>.fStore[1];
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[2];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[6];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[5];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          *local_e8 = el_nodes.super_TPZVec<long>.fStore[3];
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[2];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[6];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[7];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          *local_e8 = el_nodes.super_TPZVec<long>.fStore[4];
          local_e8[1] = el_nodes.super_TPZVec<long>.fStore[5];
          local_e8[2] = el_nodes.super_TPZVec<long>.fStore[6];
          local_e8[3] = el_nodes.super_TPZVec<long>.fStore[7];
          local_e8[4] = lVar6;
          (*(this_01->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (this_01,5,(TPZManVector<long,_5> *)&index,(ulong)uVar1,&index_1,1);
          TPZManVector<long,_5>::~TPZManVector((TPZManVector<long,_5> *)&index);
          TPZManVector<double,_3>::~TPZManVector(&x);
          TPZManVector<long,_8>::~TPZManVector(&el_nodes);
          local_208 = local_1c0;
        }
        else {
          TPZManVector<long,_8>::TPZManVector(&el_nodes,8);
          for (lVar6 = 0; this_01 = local_1e8, lVar6 != 8; lVar6 = lVar6 + 1) {
            pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_02->super_TPZChunkVector<TPZGeoNode,_10>,
                                (long)indexes.super_TPZVec<int>.fStore
                                      [perm.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                                       [lVar6]]);
            el_nodes.super_TPZVec<long>.fStore[lVar6] = (long)pTVar3->fId;
          }
          (*(local_1e8->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_1e8,7,&el_nodes,(ulong)uVar1,&index,1);
          TPZManVector<long,_8>::~TPZManVector(&el_nodes);
        }
      }
      lVar6 = local_1b8 + 1;
    }
    lVar5 = local_1d0 + 1;
  }
  TPZGeoMesh::BuildConnectivity(this_01);
  this_00 = local_1e0;
  AddBoundaryElements(local_1e0,this_01);
  if (this_00->fShouldDeform == true) {
    DeformGMesh(this_00,this_01);
  }
  TPZManVector<int,_8>::~TPZManVector(&indexes);
  TPZManVector<int,_10>::~TPZManVector(&perm.super_TPZManVector<int,_10>);
  return this_01;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(){
    
    int64_t n = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
    
    int64_t s = n + 1;
    REAL dir = 1.0;
    REAL dx = 0.5/n;
    int64_t n_nodes = gmesh->NNodes();
    TPZStack<int> perm;
    perm.push_back(0);
    perm.push_back(1);
    perm.push_back(3);
    perm.push_back(2);
    perm.push_back(4);
    perm.push_back(5);
    perm.push_back(7);
    perm.push_back(6);
    
    TPZManVector<int,8> indexes(8);
    for (int k = 0; k < n; k++) {
        for (int j = 0; j < n; j++) {
            for (int i = 0; i < n; i++) {
                
                int stride =  j*s + k*s*s;
                indexes[0] = i + stride;
                indexes[1] = i + 1 + stride;
                indexes[2] = i + s + stride;
                indexes[3] = i + 1 + s + stride;
                for (int l = 0; l < 4; l++) { // Vertical stride
                    indexes[l+4] = indexes[l]+s*s;
                }
                
                bool is_even_Q = (i+j+k)%2==0;
                if (is_even_Q) {
                    
                    TPZManVector<int64_t,8> nodes(8);
                    for (int inode=0; inode<8; inode++) {
                        nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    
                    // Adding center point
                    TPZManVector<REAL,3> x(3);
                    gmesh->NodeVec()[nodes[0]].GetCoordinates(x);
                    for (int i = 0; i < 3; i++) {
                        x[i]+=dx*dir;
                    }
                    
                    gmesh->NodeVec().Resize(n_nodes+1);
                    gmesh->NodeVec()[n_nodes].Initialize(x, *gmesh);
                    int center_id = gmesh->NodeVec()[n_nodes].Id();
                    n_nodes++;
                    
                    // inserting Pyramids
                    int64_t index;
                    TPZManVector<int64_t,5> el_nodes(5);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[2];
                    el_nodes[3] = nodes[3];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[3];
                    el_nodes[2] = nodes[7];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[5];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[1];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[5];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[3];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[4];
                    el_nodes[1] = nodes[5];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    
                }else{
                    TPZManVector<int64_t,8> el_nodes(8);
                    int64_t index;
                    for (int inode=0; inode<8; inode++) {
                        el_nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    gmesh->CreateGeoElement(ECube, el_nodes, MaterialId, index);
                }
                
            }
        }
    }
    
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    
    return gmesh;
}